

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

void __thiscall QSQLiteResult::QSQLiteResult(QSQLiteResult *this,QSQLiteDriver *db)

{
  QSQLiteResultPrivate *this_00;
  QSQLiteDriverPrivate *pQVar1;
  
  *(undefined ***)this = &PTR__QSQLiteResult_00227a40;
  this_00 = (QSQLiteResultPrivate *)operator_new(0x108);
  QSQLiteResultPrivate::QSqlResultPrivate(this_00,(QSqlResult *)this,&db->super_QSqlDriver);
  QSqlCachedResult::QSqlCachedResult
            (&this->super_QSqlCachedResult,(QSqlCachedResultPrivate *)this_00);
  *(undefined ***)this = &PTR__QSQLiteResult_00227a40;
  pQVar1 = QSQLiteResultPrivate::drv_d_func(*(QSQLiteResultPrivate **)&this->field_0x8);
  QList<QSQLiteResult_*>::append(&pQVar1->results,this);
  return;
}

Assistant:

QSQLiteResult::QSQLiteResult(const QSQLiteDriver* db)
    : QSqlCachedResult(*new QSQLiteResultPrivate(this, db))
{
    Q_D(QSQLiteResult);
    const_cast<QSQLiteDriverPrivate*>(d->drv_d_func())->results.append(this);
}